

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

bool p2t::InScanArea(Point *pa,Point *pb,Point *pc,Point *pd)

{
  if ((pd->y - pb->y) * (pa->x - pb->x) - (pa->y - pb->y) * (pd->x - pb->x) < -1e-12) {
    return 1e-12 < (pd->y - pc->y) * (pa->x - pc->x) - (pa->y - pc->y) * (pd->x - pc->x);
  }
  return false;
}

Assistant:

bool InScanArea(const Point& pa, const Point& pb, const Point& pc, const Point& pd)
{
  double oadb = (pa.x - pb.x)*(pd.y - pb.y) - (pd.x - pb.x)*(pa.y - pb.y);
  if (oadb >= -EPSILON) {
    return false;
  }

  double oadc = (pa.x - pc.x)*(pd.y - pc.y) - (pd.x - pc.x)*(pa.y - pc.y);
  if (oadc <= EPSILON) {
    return false;
  }
  return true;
}